

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

compute_mul_parity_result
fmt::v11::detail::dragonbox::cache_accessor<double>::compute_mul_parity
          (carrier_uint two_f,cache_entry_type *cache,int beta)

{
  char cVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  byte bVar5;
  uint128_fallback y;
  undefined1 local_38 [8];
  uint128_fallback r;
  int beta_local;
  cache_entry_type *cache_local;
  carrier_uint two_f_local;
  
  r.hi_._4_4_ = beta;
  if (beta < 1) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O0/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x455,"");
  }
  if (beta < 0x40) {
    y.hi_ = cache->lo_;
    y.lo_ = cache->hi_;
    _local_38 = umul192_lower128((dragonbox *)two_f,cache->lo_,y);
    uVar2 = uint128_fallback::high((uint128_fallback *)local_38);
    cVar1 = (char)r.hi_._4_4_;
    uVar3 = uint128_fallback::high((uint128_fallback *)local_38);
    bVar5 = (byte)r.hi_._4_4_;
    uVar4 = uint128_fallback::low((uint128_fallback *)local_38);
    two_f_local._6_2_ =
         (compute_mul_parity_result)
         CONCAT11(uVar3 << (bVar5 & 0x3f) == 0 && uVar4 >> (0x40U - (char)r.hi_._4_4_ & 0x3f) == 0,
                  (uVar2 >> (0x40U - cVar1 & 0x3f) & 1) != 0);
    return two_f_local._6_2_;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O0/_deps/fmt-src/include/fmt/format-inl.h"
              ,0x456,"");
}

Assistant:

static auto compute_mul_parity(carrier_uint two_f,
                                 const cache_entry_type& cache,
                                 int beta) noexcept
      -> compute_mul_parity_result {
    FMT_ASSERT(beta >= 1, "");
    FMT_ASSERT(beta < 64, "");

    auto r = umul192_lower128(two_f, cache);
    return {((r.high() >> (64 - beta)) & 1) != 0,
            ((r.high() << beta) | (r.low() >> (64 - beta))) == 0};
  }